

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_win_part(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ggml_tensor *src0;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int64_t i1;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int64_t i02;
  bool bVar24;
  undefined4 uVar25;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type == GGML_TYPE_F32) {
    uVar4 = dst->ne[0];
    lVar5 = pgVar3->ne[1];
    uVar6 = dst->ne[1];
    lVar7 = pgVar3->ne[0];
    uVar1 = dst->op_params[1];
    uVar8 = dst->ne[2];
    lVar23 = (long)dst->op_params[2];
    uVar2 = dst->op_params[0];
    local_e0 = 0;
    local_e8 = 0;
    lVar16 = lVar5 * lVar7;
    lVar9 = pgVar3->ne[2];
    lVar20 = uVar8 * uVar6 * uVar4;
    for (uVar13 = 0; uVar13 != (~((int)uVar1 >> 0x1f) & uVar1); uVar13 = uVar13 + 1) {
      local_d0 = local_e0;
      local_d8 = local_e8;
      for (uVar19 = 0; uVar19 != (~((int)uVar2 >> 0x1f) & uVar2); uVar19 = uVar19 + 1) {
        lVar12 = local_d0;
        lVar17 = local_d8;
        for (uVar18 = 0; uVar18 != (~((long)uVar8 >> 0x3f) & uVar8); uVar18 = uVar18 + 1) {
          lVar10 = lVar12;
          lVar11 = lVar17;
          for (uVar15 = 0; uVar15 != (~((long)uVar6 >> 0x3f) & uVar6); uVar15 = uVar15 + 1) {
            uVar14 = ~((long)uVar4 >> 0x3f) & uVar4;
            lVar21 = lVar11;
            lVar22 = lVar10;
            while (bVar24 = uVar14 != 0, uVar14 = uVar14 - 1, bVar24) {
              uVar25 = 0;
              if ((long)(uVar15 + uVar19 * lVar23) < lVar5 &&
                  (long)(uVar18 + uVar13 * lVar23) < lVar9) {
                uVar25 = *(undefined4 *)((long)pgVar3->data + lVar21);
              }
              lVar21 = lVar21 + 4;
              *(undefined4 *)((long)dst->data + lVar22) = uVar25;
              lVar22 = lVar22 + 4;
            }
            lVar11 = lVar11 + lVar7 * 4;
            lVar10 = lVar10 + uVar4 * 4;
          }
          lVar17 = lVar17 + lVar16 * 4;
          lVar12 = lVar12 + uVar6 * uVar4 * 4;
        }
        local_d8 = local_d8 + lVar7 * lVar23 * 4;
        local_d0 = local_d0 + lVar20 * 4;
      }
      local_e8 = local_e8 + lVar16 * lVar23 * 4;
      local_e0 = local_e0 + (int)uVar2 * lVar20 * 4;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1de6,"fatal error");
}

Assistant:

void ggml_compute_forward_win_part(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_win_part_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}